

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::quantize_images(crn_comp *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint x;
  level_details *plVar5;
  color_quad_u8 (*blocks_00) [16];
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  color_quad<unsigned_char,_int> *other;
  vector<crnlib::crn_comp::level_details> *this_01;
  float fVar6;
  float fVar7;
  float fVar8;
  float a;
  uint local_204;
  float local_1fc;
  uint local_1e8;
  bool result;
  uint dx;
  uint y;
  uint dy;
  uint x0;
  uint t;
  uint bx;
  uint y0;
  uint by;
  uint blockHeight;
  uint blockWidth;
  uint height;
  uint width;
  image_u8 *image;
  uint local_1a8;
  uint face;
  uint level;
  uint b;
  color_quad_u8 (*blocks) [16];
  uint i;
  float alpha_selector_quality;
  float alpha_endpoint_quality;
  float color_selector_quality;
  float color_endpoint_quality;
  float alpha_quality_power_mul;
  float color_quality_power_mul;
  float quality;
  uint max_codebook_entries;
  params params;
  crn_comp *this_local;
  
  params.m_pProgress_func_data = this;
  dxt_hc::params::params((params *)&quality);
  params.m_alpha_selector_codebook_size =
       (uint)this->m_pParams->m_crn_adaptive_tile_alpha_psnr_derating;
  params.m_alpha_endpoint_codebook_size =
       (uint)this->m_pParams->m_crn_adaptive_tile_color_psnr_derating;
  if ((this->m_pParams->m_flags & 0x40) == 0) {
    uVar2 = math::clamp<unsigned_int>
                      ((this->m_pParams->m_width + 3 >> 2) * (this->m_pParams->m_height + 3 >> 2),8,
                       0x2000);
    fVar6 = math::clamp<float>((float)this->m_pParams->m_quality_level / 255.0,0.0,1.0);
    color_endpoint_quality = 1.0;
    color_selector_quality = 1.0;
    if ((this->m_has_etc_color_blocks & 1U) != 0) {
      local_1fc = 1.31;
      if ((this->m_has_subblocks & 1U) == 0) {
        local_1fc = 0.7;
      }
      color_endpoint_quality = local_1fc;
      local_204 = 0x40a00000;
      if ((this->m_has_subblocks & 1U) == 0) {
        local_204 = 0x40000000;
      }
      params.m_alpha_endpoint_codebook_size = local_204;
    }
    if (this->m_pParams->m_format == cCRNFmtDXT5_CCxY) {
      color_endpoint_quality = 3.5;
      color_selector_quality = 0.35;
      params.m_alpha_endpoint_codebook_size = 0x40a00000;
    }
    else if (this->m_pParams->m_format == cCRNFmtDXT5) {
      color_endpoint_quality = 0.75;
    }
    else if (this->m_pParams->m_format == cCRNFmtETC2A) {
      color_selector_quality = 0.9;
    }
    fVar7 = powf(fVar6,color_endpoint_quality * 1.8);
    fVar8 = powf(fVar6,color_endpoint_quality * 1.65);
    a = math::maximum<float>(64.0,8.0);
    fVar7 = math::lerp<float,float>(a,(float)uVar2,fVar7);
    uVar3 = math::float_to_uint(fVar7 + 0.5);
    params.m_format = math::clamp<unsigned_int>(uVar3,8,0x2000);
    fVar7 = math::maximum<float>(96.0,8.0);
    fVar7 = math::lerp<float,float>(fVar7,(float)uVar2,fVar8);
    uVar3 = math::float_to_uint(fVar7 + 0.5);
    params._272_4_ = math::clamp<unsigned_int>(uVar3,8,0x2000);
    fVar7 = powf(fVar6,color_selector_quality * 2.1);
    fVar6 = powf(fVar6,color_selector_quality * 1.65);
    fVar8 = math::maximum<float>(24.0,8.0);
    fVar7 = math::lerp<float,float>(fVar8,(float)uVar2,fVar7);
    uVar3 = math::float_to_uint(fVar7 + 0.5);
    params.m_color_endpoint_codebook_size = math::clamp<unsigned_int>(uVar3,8,0x2000);
    fVar7 = math::maximum<float>(48.0,8.0);
    fVar6 = math::lerp<float,float>(fVar7,(float)uVar2,fVar6);
    uVar3 = math::float_to_uint(fVar6 + 0.5);
    params.m_color_selector_codebook_size = math::clamp<unsigned_int>(uVar3,8,0x2000);
  }
  else {
    params.m_format = math::clamp<int>(this->m_pParams->m_crn_color_endpoint_palette_size,8,0x2000);
    params._272_4_ = math::clamp<int>(this->m_pParams->m_crn_color_selector_palette_size,8,0x2000);
    params.m_color_endpoint_codebook_size =
         math::clamp<int>(this->m_pParams->m_crn_alpha_endpoint_palette_size,8,0x2000);
    params.m_color_selector_codebook_size =
         math::clamp<int>(this->m_pParams->m_crn_alpha_selector_palette_size,8,0x2000);
  }
  if ((this->m_pParams->m_flags & 0x80000000) != 0) {
    console::debug("Color endpoints: %u",(ulong)(uint)params.m_format);
    console::debug("Color selectors: %u",(ulong)(uint)params._272_4_);
    console::debug("Alpha endpoints: %u",(ulong)params.m_color_endpoint_codebook_size);
    console::debug("Alpha selectors: %u",(ulong)params.m_color_selector_codebook_size);
  }
  params.m_levels[0xf].m_weight._1_1_ = (undefined1)((this->m_pParams->m_flags & 2) >> 1);
  params.m_levels[0xf].m_weight._0_1_ = (byte)this->m_pParams->m_flags & 1;
  params._320_8_ = this->m_pParams->m_pProgress_func;
  params.m_pProgress_func = (crn_progress_callback_func)this->m_pParams->m_pProgress_func_data;
  switch(this->m_pParams->m_format) {
  case cCRNFmtDXT1:
    params.m_levels[0xf].m_block_width = 0;
    this->m_has_comp[0] = true;
    break;
  case cCRNFmtDXT3:
    this->m_has_comp[1] = true;
    return false;
  case cCRNFmtDXT5:
    params.m_levels[0xf].m_block_width = 3;
    params.m_adaptive_tile_alpha_psnr_derating = (float)this->m_pParams->m_alpha_component;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    break;
  case cCRNFmtDXT5_CCxY:
    params.m_levels[0xf].m_block_width = 3;
    params.m_adaptive_tile_alpha_psnr_derating = 4.2039e-45;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    params.m_levels[0xf].m_weight._0_1_ = 0;
    params.m_adaptive_tile_color_psnr_derating = 1.5;
    break;
  case cCRNFmtDXT5_xGxR:
  case cCRNFmtDXT5_xGBR:
  case cCRNFmtDXT5_AGBR:
    params.m_levels[0xf].m_block_width = 3;
    params.m_adaptive_tile_alpha_psnr_derating = 4.2039e-45;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    params.m_levels[0xf].m_weight._0_1_ = 0;
    break;
  case cCRNFmtDXN_XY:
    params.m_levels[0xf].m_block_width = 5;
    params.m_adaptive_tile_alpha_psnr_derating = 0.0;
    params.m_adaptive_tile_color_alpha_weighting_ratio = 1.4013e-45;
    this->m_has_comp[1] = true;
    this->m_has_comp[2] = true;
    params.m_levels[0xf].m_weight._0_1_ = 0;
    break;
  case cCRNFmtDXN_YX:
    params.m_levels[0xf].m_block_width = 6;
    params.m_adaptive_tile_alpha_psnr_derating = 1.4013e-45;
    params.m_adaptive_tile_color_alpha_weighting_ratio = 0.0;
    this->m_has_comp[1] = true;
    this->m_has_comp[2] = true;
    params.m_levels[0xf].m_weight._0_1_ = 0;
    break;
  case cCRNFmtDXT5A:
    params.m_levels[0xf].m_block_width = 4;
    params.m_adaptive_tile_alpha_psnr_derating = (float)this->m_pParams->m_alpha_component;
    this->m_has_comp[1] = true;
    params.m_levels[0xf].m_weight._0_1_ = 0;
    break;
  case cCRNFmtETC1:
    params.m_levels[0xf].m_block_width = 7;
    this->m_has_comp[0] = true;
    break;
  case cCRNFmtETC2:
    params.m_levels[0xf].m_block_width = 8;
    this->m_has_comp[0] = true;
    break;
  case cCRNFmtETC2A:
    params.m_levels[0xf].m_block_width = 9;
    params.m_adaptive_tile_alpha_psnr_derating = (float)this->m_pParams->m_alpha_component;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    break;
  case cCRNFmtETC1S:
    params.m_levels[0xf].m_block_width = 10;
    this->m_has_comp[0] = true;
    break;
  case cCRNFmtETC2AS:
    params.m_levels[0xf].m_block_width = 0xb;
    params.m_adaptive_tile_alpha_psnr_derating = (float)this->m_pParams->m_alpha_component;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    break;
  default:
    return false;
  }
  params.m_pTask_pool._0_1_ = (this->m_pParams->m_flags & 0x80000000) != 0;
  params.m_alpha_component_indices = (uint  [2])&this->m_task_pool;
  max_codebook_entries = this->m_pParams->m_levels;
  for (blocks._4_4_ = 0; blocks._4_4_ < this->m_pParams->m_levels; blocks._4_4_ = blocks._4_4_ + 1)
  {
    this_01 = &this->m_levels;
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](this_01,blocks._4_4_);
    params.m_levels[(ulong)blocks._4_4_ - 1].m_block_width = plVar5->first_block;
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](this_01,blocks._4_4_);
    params.m_levels[(ulong)blocks._4_4_ - 1].m_weight = (float)plVar5->num_blocks;
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](this_01,blocks._4_4_);
    params.m_levels[blocks._4_4_].m_first_block = plVar5->block_width;
    fVar6 = powf(1.3,(float)blocks._4_4_);
    fVar6 = math::minimum<float>(12.0,fVar6);
    params.m_levels[blocks._4_4_].m_num_blocks = (uint)fVar6;
  }
  params.m_num_blocks = this->m_pParams->m_faces;
  quality = (float)this->m_total_blocks;
  blocks_00 = (color_quad_u8 (*) [16])crnlib_malloc((ulong)(uint)((int)quality << 4) << 2);
  face = 0;
  for (local_1a8 = 0; local_1a8 < this->m_pParams->m_levels; local_1a8 = local_1a8 + 1) {
    for (image._4_4_ = 0; image._4_4_ < this->m_pParams->m_faces; image._4_4_ = image._4_4_ + 1) {
      this_00 = this->m_images[image._4_4_] + local_1a8;
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(this_00);
      uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(this_00);
      for (bx = 0; bx < (uVar4 + 7 & 0xfffffff8) >> 2; bx = bx + 1) {
        for (x0 = 0; x0 < (uVar3 + 7 & 0xfffffff8) >> 2; x0 = x0 + 1) {
          dy = 0;
          for (dx = 0; dx < 4; dx = dx + 1) {
            uVar2 = math::minimum<unsigned_int>(bx * 4 + dx,uVar4 - 1);
            for (local_1e8 = 0; local_1e8 < 4; local_1e8 = local_1e8 + 1) {
              x = math::minimum<unsigned_int>(x0 * 4 + local_1e8,uVar3 - 1);
              other = image<crnlib::color_quad<unsigned_char,_int>_>::operator()(this_00,x,uVar2);
              color_quad<unsigned_char,_int>::operator=(blocks_00[face] + dy,other);
              dy = dy + 1;
            }
          }
          face = face + 1;
        }
      }
    }
  }
  bVar1 = dxt_hc::compress(&this->m_hvq,blocks_00,&this->m_endpoint_indices,
                           &this->m_selector_indices,&this->m_color_endpoints,
                           &this->m_alpha_endpoints,&this->m_color_selectors,
                           &this->m_alpha_selectors,(params *)&quality);
  crnlib_free(blocks_00);
  return bVar1;
}

Assistant:

bool crn_comp::quantize_images()
    {
        dxt_hc::params params;

        params.m_adaptive_tile_alpha_psnr_derating = m_pParams->m_crn_adaptive_tile_alpha_psnr_derating;
        params.m_adaptive_tile_color_psnr_derating = m_pParams->m_crn_adaptive_tile_color_psnr_derating;

        if (m_pParams->m_flags & cCRNCompFlagManualPaletteSizes)
        {
            params.m_color_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_color_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_color_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }
        else
        {
            uint max_codebook_entries = ((m_pParams->m_width + 3) / 4) * ((m_pParams->m_height + 3) / 4);

            max_codebook_entries = math::clamp<uint>(max_codebook_entries, cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float quality = math::clamp<float>((float)m_pParams->m_quality_level / cCRNMaxQualityLevel, 0.0f, 1.0f);
            float color_quality_power_mul = 1.0f;
            float alpha_quality_power_mul = 1.0f;
            if (m_has_etc_color_blocks)
            {
                color_quality_power_mul = m_has_subblocks ? 1.31f : 0.7f;
                params.m_adaptive_tile_color_psnr_derating = m_has_subblocks ? 5.0f : 2.0f;
            }
            if (m_pParams->m_format == cCRNFmtDXT5_CCxY)
            {
                color_quality_power_mul = 3.5f;
                alpha_quality_power_mul = .35f;
                params.m_adaptive_tile_color_psnr_derating = 5.0f;
            }
            else if (m_pParams->m_format == cCRNFmtDXT5)
            {
                color_quality_power_mul = .75f;
            }
            else if (m_pParams->m_format == cCRNFmtETC2A)
            {
                alpha_quality_power_mul = .9f;
            }

            float color_endpoint_quality = powf(quality, 1.8f * color_quality_power_mul);
            float color_selector_quality = powf(quality, 1.65f * color_quality_power_mul);
            params.m_color_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(64, cCRNMinPaletteSize), (float)max_codebook_entries, color_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(96, cCRNMinPaletteSize), (float)max_codebook_entries, color_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float alpha_endpoint_quality = powf(quality, 2.1f * alpha_quality_power_mul);
            float alpha_selector_quality = powf(quality, 1.65f * alpha_quality_power_mul);
            params.m_alpha_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(24, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(48, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            console::debug("Color endpoints: %u", params.m_color_endpoint_codebook_size);
            console::debug("Color selectors: %u", params.m_color_selector_codebook_size);
            console::debug("Alpha endpoints: %u", params.m_alpha_endpoint_codebook_size);
            console::debug("Alpha selectors: %u", params.m_alpha_selector_codebook_size);
        }

        params.m_hierarchical = (m_pParams->m_flags & cCRNCompFlagHierarchical) != 0;
        params.m_perceptual = (m_pParams->m_flags & cCRNCompFlagPerceptual) != 0;

        params.m_pProgress_func = m_pParams->m_pProgress_func;
        params.m_pProgress_func_data = m_pParams->m_pProgress_func_data;

        switch (m_pParams->m_format)
        {
        case cCRNFmtDXT1:
        {
            params.m_format = cDXT1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtDXT3:
        {
            m_has_comp[cAlpha0] = true;
            return false;
        }
        case cCRNFmtDXT5:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtDXT5_CCxY:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;

            //params.m_adaptive_tile_color_alpha_weighting_ratio = 1.0f;
            params.m_adaptive_tile_color_alpha_weighting_ratio = 1.5f;
            break;
        }
        case cCRNFmtDXT5_xGBR:
        case cCRNFmtDXT5_AGBR:
        case cCRNFmtDXT5_xGxR:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_XY:
        {
            params.m_format = cDXN_XY;
            params.m_alpha_component_indices[0] = 0;
            params.m_alpha_component_indices[1] = 1;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_YX:
        {
            params.m_format = cDXN_YX;
            params.m_alpha_component_indices[0] = 1;
            params.m_alpha_component_indices[1] = 0;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXT5A:
        {
            params.m_format = cDXT5A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtETC1:
        {
            params.m_format = cETC1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2:
        {
            params.m_format = cETC2;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2A:
        {
            params.m_format = cETC2A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtETC1S:
        {
            params.m_format = cETC1S;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2AS:
        {
            params.m_format = cETC2AS;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        default:
        {
            return false;
        }
        }
        params.m_debugging = (m_pParams->m_flags & cCRNCompFlagDebugging) != 0;
        params.m_pTask_pool = &m_task_pool;

        params.m_num_levels = m_pParams->m_levels;
        for (uint i = 0; i < m_pParams->m_levels; i++)
        {
            params.m_levels[i].m_first_block = m_levels[i].first_block;
            params.m_levels[i].m_num_blocks = m_levels[i].num_blocks;
            params.m_levels[i].m_block_width = m_levels[i].block_width;
            params.m_levels[i].m_weight = math::minimum(12.0f, powf(1.3f, (float)i));
        }
        params.m_num_faces = m_pParams->m_faces;
        params.m_num_blocks = m_total_blocks;
        color_quad_u8(*blocks)[16] = (color_quad_u8(*)[16])crnlib_malloc(params.m_num_blocks * 16 * sizeof(color_quad_u8));
        for (uint b = 0, level = 0; level < m_pParams->m_levels; level++)
        {
            for (uint face = 0; face < m_pParams->m_faces; face++)
            {
                image_u8& image = m_images[face][level];
                uint width = image.get_width();
                uint height = image.get_height();
                uint blockWidth = ((width + 7) & ~7) >> 2;
                uint blockHeight = ((height + 7) & ~7) >> 2;
                for (uint by = 0; by < blockHeight; by++)
                {
                    for (uint y0 = by << 2, bx = 0; bx < blockWidth; bx++, b++)
                    {
                        for (uint t = 0, x0 = bx << 2, dy = 0; dy < 4; dy++)
                        {
                            for (uint y = math::minimum<uint>(y0 + dy, height - 1), dx = 0; dx < 4; dx++, t++)
                            {
                                blocks[b][t] = image(math::minimum<uint>(x0 + dx, width - 1), y);
                            }
                        }
                    }
                }
            }
        }
        bool result = m_hvq.compress(blocks, m_endpoint_indices, m_selector_indices, m_color_endpoints, m_alpha_endpoints, m_color_selectors, m_alpha_selectors, params);
        crnlib_free(blocks);

        return result;
    }